

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonRemoveFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  int iVar1;
  char *pcVar2;
  JsonNode *pJVar3;
  ulong uVar4;
  JsonParse x;
  JsonParse local_68;
  
  if (0 < argc) {
    pcVar2 = (char *)sqlite3ValueText(*argv,'\x01');
    iVar1 = jsonParse(&local_68,ctx,pcVar2);
    if (iVar1 == 0) {
      if (argc != 1) {
        uVar4 = 1;
        do {
          pcVar2 = (char *)sqlite3ValueText(argv[uVar4],'\x01');
          if ((pcVar2 == (char *)0x0) ||
             (pJVar3 = jsonLookup(&local_68,pcVar2,(int *)0x0,ctx), local_68.nErr != '\0'))
          goto LAB_001e2c9f;
          if (pJVar3 != (JsonNode *)0x0) {
            pJVar3->jnFlags = pJVar3->jnFlags | 4;
          }
          uVar4 = uVar4 + 1;
        } while ((uint)argc != uVar4);
      }
      if (((local_68.aNode)->jnFlags & 4) == 0) {
        jsonReturnJson(local_68.aNode,ctx,(sqlite3_value **)0x0);
      }
LAB_001e2c9f:
      sqlite3_free(local_68.aNode);
      local_68.nNode = 0;
      local_68.nAlloc = 0;
      local_68.aNode = (JsonNode *)0x0;
      sqlite3_free(local_68.aUp);
    }
  }
  return;
}

Assistant:

static void jsonRemoveFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse x;          /* The parse */
  JsonNode *pNode;
  const char *zPath;
  u32 i;

  if( argc<1 ) return;
  if( jsonParse(&x, ctx, (const char*)sqlite3_value_text(argv[0])) ) return;
  assert( x.nNode );
  for(i=1; i<(u32)argc; i++){
    zPath = (const char*)sqlite3_value_text(argv[i]);
    if( zPath==0 ) goto remove_done;
    pNode = jsonLookup(&x, zPath, 0, ctx);
    if( x.nErr ) goto remove_done;
    if( pNode ) pNode->jnFlags |= JNODE_REMOVE;
  }
  if( (x.aNode[0].jnFlags & JNODE_REMOVE)==0 ){
    jsonReturnJson(x.aNode, ctx, 0);
  }
remove_done:
  jsonParseReset(&x);
}